

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O0

int mbedtls_ecdsa_sign_det
              (mbedtls_ecp_group *grp,mbedtls_mpi *r,mbedtls_mpi *s,mbedtls_mpi *d,uchar *buf,
              size_t blen,mbedtls_md_type_t md_alg)

{
  ulong buflen;
  undefined1 local_180 [8];
  mbedtls_mpi h;
  mbedtls_md_info_t *md_info;
  size_t grp_len;
  uchar data [132];
  undefined1 local_c8 [8];
  mbedtls_hmac_drbg_context rng_ctx;
  int ret;
  size_t blen_local;
  uchar *buf_local;
  mbedtls_mpi *d_local;
  mbedtls_mpi *s_local;
  mbedtls_mpi *r_local;
  mbedtls_ecp_group *grp_local;
  
  buflen = grp->nbits + 7 >> 3;
  h.p = (mbedtls_mpi_uint *)mbedtls_md_info_from_type(md_alg);
  if ((mbedtls_md_info_t *)h.p == (mbedtls_md_info_t *)0x0) {
    grp_local._4_4_ = -0x4f80;
  }
  else {
    mbedtls_mpi_init((mbedtls_mpi *)local_180);
    mbedtls_hmac_drbg_init((mbedtls_hmac_drbg_context *)local_c8);
    rng_ctx.p_entropy._4_4_ = mbedtls_mpi_write_binary(d,(uchar *)&grp_len,buflen);
    if (((rng_ctx.p_entropy._4_4_ == 0) &&
        (rng_ctx.p_entropy._4_4_ = derive_mpi(grp,(mbedtls_mpi *)local_180,buf,blen),
        rng_ctx.p_entropy._4_4_ == 0)) &&
       (rng_ctx.p_entropy._4_4_ =
             mbedtls_mpi_write_binary((mbedtls_mpi *)local_180,data + (buflen - 8),buflen),
       rng_ctx.p_entropy._4_4_ == 0)) {
      mbedtls_hmac_drbg_seed_buf
                ((mbedtls_hmac_drbg_context *)local_c8,(mbedtls_md_info_t *)h.p,(uchar *)&grp_len,
                 buflen << 1);
      rng_ctx.p_entropy._4_4_ =
           mbedtls_ecdsa_sign(grp,r,s,d,buf,blen,mbedtls_hmac_drbg_random,local_c8);
    }
    mbedtls_hmac_drbg_free((mbedtls_hmac_drbg_context *)local_c8);
    mbedtls_mpi_free((mbedtls_mpi *)local_180);
    grp_local._4_4_ = rng_ctx.p_entropy._4_4_;
  }
  return grp_local._4_4_;
}

Assistant:

int mbedtls_ecdsa_sign_det( mbedtls_ecp_group *grp, mbedtls_mpi *r, mbedtls_mpi *s,
                    const mbedtls_mpi *d, const unsigned char *buf, size_t blen,
                    mbedtls_md_type_t md_alg )
{
    int ret;
    mbedtls_hmac_drbg_context rng_ctx;
    unsigned char data[2 * MBEDTLS_ECP_MAX_BYTES];
    size_t grp_len = ( grp->nbits + 7 ) / 8;
    const mbedtls_md_info_t *md_info;
    mbedtls_mpi h;

    if( ( md_info = mbedtls_md_info_from_type( md_alg ) ) == NULL )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    mbedtls_mpi_init( &h );
    mbedtls_hmac_drbg_init( &rng_ctx );

    /* Use private key and message hash (reduced) to initialize HMAC_DRBG */
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( d, data, grp_len ) );
    MBEDTLS_MPI_CHK( derive_mpi( grp, &h, buf, blen ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &h, data + grp_len, grp_len ) );
    mbedtls_hmac_drbg_seed_buf( &rng_ctx, md_info, data, 2 * grp_len );

    ret = mbedtls_ecdsa_sign( grp, r, s, d, buf, blen,
                      mbedtls_hmac_drbg_random, &rng_ctx );

cleanup:
    mbedtls_hmac_drbg_free( &rng_ctx );
    mbedtls_mpi_free( &h );

    return( ret );
}